

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_image *
nk_subimage_ptr(nk_image *__return_storage_ptr__,void *ptr,unsigned_short w,unsigned_short h,
               nk_rect r)

{
  undefined1 auVar1 [16];
  float local_48;
  float fStack_44;
  
  nk_zero(__return_storage_ptr__,0x18);
  (__return_storage_ptr__->handle).ptr = ptr;
  __return_storage_ptr__->w = w;
  __return_storage_ptr__->h = h;
  local_48 = r.x;
  fStack_44 = r.y;
  auVar1._0_4_ = (int)local_48;
  auVar1._4_4_ = (int)fStack_44;
  auVar1._8_4_ = (int)r.w;
  auVar1._12_4_ = (int)r.h;
  auVar1 = pshuflw(auVar1,auVar1,0xe8);
  auVar1 = pshufhw(auVar1,auVar1,0xe8);
  *(ulong *)__return_storage_ptr__->region = CONCAT44(auVar1._8_4_,auVar1._0_4_);
  return __return_storage_ptr__;
}

Assistant:

NK_API struct nk_image
nk_subimage_ptr(void *ptr, unsigned short w, unsigned short h, struct nk_rect r)
{
    struct nk_image s;
    nk_zero(&s, sizeof(s));
    s.handle.ptr = ptr;
    s.w = w; s.h = h;
    s.region[0] = (unsigned short)r.x;
    s.region[1] = (unsigned short)r.y;
    s.region[2] = (unsigned short)r.w;
    s.region[3] = (unsigned short)r.h;
    return s;
}